

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O2

int mbedtls_md_hmac(mbedtls_md_info_t *md_info,uchar *key,size_t keylen,uchar *input,size_t ilen,
                   uchar *output)

{
  int iVar1;
  mbedtls_md_context_t ctx;
  
  if (md_info != (mbedtls_md_info_t *)0x0) {
    ctx.md_info = (mbedtls_md_info_t *)0x0;
    ctx.md_ctx = (void *)0x0;
    ctx.hmac_ctx = (void *)0x0;
    iVar1 = mbedtls_md_setup(&ctx,md_info,1);
    if (iVar1 == 0) {
      mbedtls_md_hmac_starts(&ctx,key,keylen);
      if ((ctx.md_info != (mbedtls_md_info_t *)0x0) && (ctx.hmac_ctx != (void *)0x0)) {
        (*(ctx.md_info)->update_func)(ctx.md_ctx,input,ilen);
      }
      mbedtls_md_hmac_finish(&ctx,output);
      mbedtls_md_free(&ctx);
      iVar1 = 0;
    }
    return iVar1;
  }
  return -0x5100;
}

Assistant:

int mbedtls_md_hmac( const mbedtls_md_info_t *md_info, const unsigned char *key, size_t keylen,
                const unsigned char *input, size_t ilen,
                unsigned char *output )
{
    mbedtls_md_context_t ctx;
    int ret;

    if( md_info == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    mbedtls_md_init( &ctx );

    if( ( ret = mbedtls_md_setup( &ctx, md_info, 1 ) ) != 0 )
        return( ret );

    mbedtls_md_hmac_starts( &ctx, key, keylen );
    mbedtls_md_hmac_update( &ctx, input, ilen );
    mbedtls_md_hmac_finish( &ctx, output );

    mbedtls_md_free( &ctx );

    return( 0 );
}